

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkTransferCopy(Abc_Ntk_t *pNtk)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  ulong uVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < pNtk->vObjs->nSize; i_00 = i_00 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,i_00);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) != 6)) {
      aVar1 = pAVar3->field_6;
      if (aVar1.pTemp == (void *)0x0) {
        pvVar4 = (void *)0x0;
      }
      else {
        uVar2 = *(ulong *)(((ulong)aVar1.pTemp & 0xfffffffffffffffe) + 0x40);
        pvVar4 = (void *)(aVar1.iTemp & 1 ^ uVar2);
        if (uVar2 == 0) {
          pvVar4 = (void *)0x0;
        }
      }
      (pAVar3->field_6).pTemp = pvVar4;
    }
  }
  return;
}

Assistant:

void Abc_NtkTransferCopy( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsNet(pObj) )
            pObj->pCopy = pObj->pCopy? Abc_ObjCopyCond(pObj->pCopy) : NULL;
}